

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O1

void __thiscall wasm::ReReloop::~ReReloop(ReReloop *this)

{
  Builder *pBVar1;
  Relooper *__ptr;
  
  std::
  vector<std::shared_ptr<wasm::ReReloop::Task>,_std::allocator<std::shared_ptr<wasm::ReReloop::Task>_>_>
  ::~vector(&this->stack);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_CFG::Block_*>,_std::_Select1st<std::pair<const_wasm::Name,_CFG::Block_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_CFG::Block_*>_>_>
  ::~_Rb_tree(&(this->breakTargets)._M_t);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  if (pBVar1 != (Builder *)0x0) {
    operator_delete(pBVar1,8);
  }
  (this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
  _M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
  super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl = (Builder *)0x0;
  __ptr = (this->relooper)._M_t.
          super___uniq_ptr_impl<CFG::Relooper,_std::default_delete<CFG::Relooper>_>._M_t.
          super__Tuple_impl<0UL,_CFG::Relooper_*,_std::default_delete<CFG::Relooper>_>.
          super__Head_base<0UL,_CFG::Relooper_*,_false>._M_head_impl;
  if (__ptr != (Relooper *)0x0) {
    std::default_delete<CFG::Relooper>::operator()
              ((default_delete<CFG::Relooper> *)&this->relooper,__ptr);
  }
  (this->relooper)._M_t.super___uniq_ptr_impl<CFG::Relooper,_std::default_delete<CFG::Relooper>_>.
  _M_t.super__Tuple_impl<0UL,_CFG::Relooper_*,_std::default_delete<CFG::Relooper>_>.
  super__Head_base<0UL,_CFG::Relooper_*,_false>._M_head_impl = (Relooper *)0x0;
  Pass::~Pass(&this->super_Pass);
  operator_delete(this,0xb8);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }